

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlAutomataNewCounter(void)

{
  int iVar1;
  int iVar2;
  int val;
  int val_00;
  uint local_34;
  int n_max;
  int max;
  int n_min;
  int min;
  int n_am;
  xmlAutomataPtr am;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_min = 0; n_min < 1; n_min = n_min + 1) {
    for (n_max = 0; n_max < 4; n_max = n_max + 1) {
      for (local_34 = 0; (int)local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        iVar2 = gen_int(n_max,1);
        val = gen_int(local_34,2);
        val_00 = xmlAutomataNewCounter(0,iVar2,val);
        desret_int(val_00);
        call_tests = call_tests + 1;
        des_int(n_max,iVar2,1);
        des_int(local_34,val,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlAutomataNewCounter",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)(uint)n_min);
          printf(" %d",(ulong)(uint)n_max);
          printf(" %d",(ulong)local_34);
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlAutomataNewCounter(void) {
    int test_ret = 0;

#if defined(LIBXML_REGEXP_ENABLED)
    int mem_base;
    int ret_val;
    xmlAutomataPtr am; /* an automata */
    int n_am;
    int min; /* the minimal value on the counter */
    int n_min;
    int max; /* the maximal value on the counter */
    int n_max;

    for (n_am = 0;n_am < gen_nb_xmlAutomataPtr;n_am++) {
    for (n_min = 0;n_min < gen_nb_int;n_min++) {
    for (n_max = 0;n_max < gen_nb_int;n_max++) {
        mem_base = xmlMemBlocks();
        am = gen_xmlAutomataPtr(n_am, 0);
        min = gen_int(n_min, 1);
        max = gen_int(n_max, 2);

        ret_val = xmlAutomataNewCounter(am, min, max);
        desret_int(ret_val);
        call_tests++;
        des_xmlAutomataPtr(n_am, am, 0);
        des_int(n_min, min, 1);
        des_int(n_max, max, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlAutomataNewCounter",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_am);
            printf(" %d", n_min);
            printf(" %d", n_max);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}